

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void recff_cdata_call(jit_State *J,RecordFFData *rd)

{
  CTState *cts_00;
  int iVar1;
  GCcdata *cd_00;
  cTValue *tv_00;
  CTypeID local_bc;
  MMS local_ac;
  MMS mm;
  cTValue *tv;
  CType *ct;
  CTypeID id;
  GCcdata *cd;
  CTState *cts;
  RecordFFData *rd_local;
  jit_State *J_local;
  CType *ct_1;
  
  cts_00 = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  cd_00 = argv2cdata(J,*J->base,rd->argv);
  ct._4_4_ = (CTypeID)cd_00->ctypeid;
  local_ac = MM_call;
  if (ct._4_4_ == 0x16) {
    ct._4_4_ = crec_constructor(J,cd_00,*J->base);
    local_ac = MM_new;
  }
  else {
    iVar1 = crec_call(J,rd,cd_00);
    if (iVar1 != 0) {
      return;
    }
  }
  J_local = (jit_State *)(cts_00->tab + ct._4_4_);
  while ((uint)(J_local->cur).nextgc.gcptr64 >> 0x1c == 8) {
    J_local = (jit_State *)(cts_00->tab + ((uint)(J_local->cur).nextgc.gcptr64 & 0xffff));
  }
  if ((uint)(J_local->cur).nextgc.gcptr64 >> 0x1c == 2) {
    local_bc = (uint)(J_local->cur).nextgc.gcptr64 & 0xffff;
  }
  else {
    local_bc = ct._4_4_;
  }
  tv_00 = lj_ctype_meta(cts_00,local_bc,local_ac);
  if (tv_00 == (cTValue *)0x0) {
    if (local_ac != MM_new) goto LAB_001b1341;
    crec_alloc(J,rd,ct._4_4_);
  }
  else {
    if ((int)(tv_00->field_4).it >> 0xf != -9) {
LAB_001b1341:
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    crec_tailcall(J,rd,tv_00);
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_cdata_call(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  GCcdata *cd = argv2cdata(J, J->base[0], &rd->argv[0]);
  CTypeID id = cd->ctypeid;
  CType *ct;
  cTValue *tv;
  MMS mm = MM_call;
  if (id == CTID_CTYPEID) {
    id = crec_constructor(J, cd, J->base[0]);
    mm = MM_new;
  } else if (crec_call(J, rd, cd)) {
    return;
  }
  /* Record ctype __call/__new metamethod. */
  ct = ctype_raw(cts, id);
  tv = lj_ctype_meta(cts, ctype_isptr(ct->info) ? ctype_cid(ct->info) : id, mm);
  if (tv) {
    if (tvisfunc(tv)) {
      crec_tailcall(J, rd, tv);
      return;
    }
  } else if (mm == MM_new) {
    crec_alloc(J, rd, id);
    return;
  }
  /* No metamethod or NYI: non-function metamethods. */
  lj_trace_err(J, LJ_TRERR_BADTYPE);
}